

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfilters.c
# Opt level: O3

void Curl_conn_close(Curl_easy *data,int index)

{
  Curl_cfilter *pCVar1;
  
  pCVar1 = data->conn->cfilter[index];
  if (pCVar1 != (Curl_cfilter *)0x0) {
    (*(code *)pCVar1->cft->do_close)(pCVar1,data);
  }
  Curl_shutdown_clear(data,index);
  return;
}

Assistant:

void Curl_conn_close(struct Curl_easy *data, int index)
{
  struct Curl_cfilter *cf;

  DEBUGASSERT(data->conn);
  /* it is valid to call that without filters being present */
  cf = data->conn->cfilter[index];
  if(cf) {
    cf->cft->do_close(cf, data);
  }
  Curl_shutdown_clear(data, index);
}